

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Any_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  ulong *puVar1;
  uint64_t uVar2;
  ulong *puVar3;
  ulong uVar4;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar4 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar4 = (long)buf[6] << 8;
    case 6:
      uVar4 = uVar4 | (long)buf[5] << 0x10;
    case 5:
      uVar4 = uVar4 | (long)buf[4] << 0x18;
    case 4:
      uVar4 = uVar4 | (long)buf[3] << 0x20;
    case 3:
      uVar4 = uVar4 | (long)buf[2] << 0x28;
    case 2:
      uVar4 = uVar4 | (long)buf[1] << 0x30;
    case 1:
      uVar4 = uVar4 | (ulong)(byte)*buf << 0x38;
    }
  }
  else {
    uVar4 = *(ulong *)buf;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  }
  if (uVar4 < 0x4d6f6e7374657200) {
    if ((uVar4 & 0x7fffff0000000000) != 0x416c740000000000) {
      return buf;
    }
    puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,buf,end,3,aggregate);
    if (puVar1 == (ulong *)buf) {
      return buf;
    }
    uVar2 = 4;
    goto LAB_001119e7;
  }
  if (uVar4 == 0x4d6f6e7374657232) {
    puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,buf,end,8,aggregate);
    uVar2 = 3;
LAB_001119ad:
    puVar3 = puVar1;
    if (puVar1 != (ulong *)buf) goto LAB_001119e7;
  }
  else {
    puVar3 = (ulong *)buf;
    if ((uVar4 & 0xffffffffffffff00) == 0x4d6f6e7374657200) {
      puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
      uVar2 = 1;
      goto LAB_001119ad;
    }
  }
  puVar1 = puVar3;
  if (((int)(uVar4 >> 0x20) == 0x4e4f4e45) &&
     (puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,(char *)puVar3,end,4,aggregate),
     puVar1 != puVar3)) {
    uVar2 = 0;
  }
  else {
    if (uVar4 != 0x5465737453696d70) {
      return buf;
    }
    puVar3 = puVar1 + 1;
    if ((ulong)((long)end - (long)puVar3) < 8) {
      uVar4 = 0;
      switch((long)end - (long)puVar3) {
      case 7:
        uVar4 = (long)(char)*(byte *)((long)puVar1 + 0xe) << 8;
      case 6:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0xd) << 0x10;
      case 5:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0xc) << 0x18;
      case 4:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0xb) << 0x20;
      case 3:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 10) << 0x28;
      case 2:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 9) << 0x30;
      case 1:
        uVar4 = uVar4 | (ulong)(byte)*puVar3 << 0x38;
      }
    }
    else {
      uVar4 = *puVar3;
      uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    }
    if (uVar4 != 0x6c655461626c6557) {
      return buf;
    }
    puVar3 = puVar1 + 2;
    if ((ulong)((long)end - (long)puVar3) < 8) {
      uVar4 = 0;
      switch((long)end - (long)puVar3) {
      case 7:
        uVar4 = (long)(char)*(byte *)((long)puVar1 + 0x16) << 8;
      case 6:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0x15) << 0x10;
      case 5:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0x14) << 0x18;
      case 4:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0x13) << 0x20;
      case 3:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0x12) << 0x28;
      case 2:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)puVar1 + 0x11) << 0x30;
      case 1:
        uVar4 = uVar4 | (ulong)(byte)*puVar3 << 0x38;
      }
    }
    else {
      uVar4 = *puVar3;
      uVar4 = (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
              (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
              (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    }
    if (uVar4 != 0x697468456e756d00) {
      return buf;
    }
    puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,(char *)puVar3,end,7,aggregate);
    if (puVar1 == puVar3) {
      return buf;
    }
    uVar2 = 2;
  }
LAB_001119e7:
  *value = uVar2;
  *value_sign = 0;
  return (char *)puVar1;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4d6f6e7374657200) { /* branch "Monster" */
        if ((w & 0xffffff0000000000) == 0x416c740000000000) { /* "Alt" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 3, aggregate);
            if (buf != mark) {
                *value = UINT64_C(4), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "Alt" */
            return unmatched;
        } /* "Alt" */
    } else { /* branch "Monster" */
        if (w == 0x4d6f6e7374657232) { /* "Monster2" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 8, aggregate);
            if (buf != mark) {
                *value = UINT64_C(3), *value_sign = 0;
            } else {
                goto pfguard1;
            }
        } else { /* "Monster2" */
            if ((w & 0xffffffffffffff00) == 0x4d6f6e7374657200) { /* "Monster" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    goto pfguard1;
                }
            } else { /* "Monster" */
                goto pfguard1;
            } /* "Monster" */
        } /* "Monster2" */
        goto endpfguard1;
pfguard1:
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                goto pfguard2;
            }
        } else { /* "NONE" */
            goto pfguard2;
        } /* "NONE" */
        goto endpfguard2;
pfguard2:
        if (w == 0x5465737453696d70) { /* descend "TestSimp" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x6c655461626c6557) { /* descend "leTableW" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x697468456e756d00) { /* "ithEnum" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(2), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "ithEnum" */
                    return unmatched;
                } /* "ithEnum" */
            } else { /* descend "leTableW" */
                return unmatched;
            } /* descend "leTableW" */
        } else { /* descend "TestSimp" */
            return unmatched;
        } /* descend "TestSimp" */
endpfguard2:
        (void)0;
endpfguard1:
        (void)0;
    } /* branch "Monster" */
    return buf;
}